

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  IResultCapture *pIVar1;
  string local_30 [32];
  
  MessageInfo::MessageInfo(&this->m_info,&builder->m_info);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(this->m_info).message,local_30);
  std::__cxx11::string::~string(local_30);
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[5])(pIVar1,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info )
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }